

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

void __thiscall ON_RevSurface::ON_RevSurface(ON_RevSurface *this,ON_RevSurface *src)

{
  ON_Curve *local_48;
  ON_RevSurface *src_local;
  ON_RevSurface *this_local;
  
  ON_Surface::ON_Surface(&this->super_ON_Surface,&src->super_ON_Surface);
  (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b783c0;
  ON_Line::ON_Line(&this->m_axis);
  ON_Interval::ON_Interval(&this->m_angle);
  ON_Interval::ON_Interval(&this->m_t);
  ON_BoundingBox::ON_BoundingBox(&this->m_bbox);
  if (m_s_ON_RevSurface_ptr != (void *)0x0) {
    (this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
         (_func_int **)m_s_ON_RevSurface_ptr;
  }
  if (src->m_curve == (ON_Curve *)0x0) {
    local_48 = (ON_Curve *)0x0;
  }
  else {
    local_48 = ON_Curve::Duplicate(src->m_curve);
  }
  this->m_curve = local_48;
  memcpy(&this->m_axis,&src->m_axis,0x30);
  (this->m_angle).m_t[0] = (src->m_angle).m_t[0];
  (this->m_angle).m_t[1] = (src->m_angle).m_t[1];
  (this->m_t).m_t[0] = (src->m_t).m_t[0];
  (this->m_t).m_t[1] = (src->m_t).m_t[1];
  this->m_bTransposed = (bool)(src->m_bTransposed & 1);
  memcpy(&this->m_bbox,&src->m_bbox,0x30);
  return;
}

Assistant:

ON_RevSurface::ON_RevSurface( const ON_RevSurface& src ) : ON_Surface(src)
{
  ON__SET__THIS__PTR(m_s_ON_RevSurface_ptr);
  m_curve = src.m_curve ? src.m_curve->Duplicate() : nullptr;
  m_axis = src.m_axis;
  m_angle = src.m_angle;
  m_t = src.m_t;
  m_bTransposed = src.m_bTransposed;
  m_bbox = src.m_bbox;
}